

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O2

bool __thiscall
ON_TextureMapping::SetPlaneMapping
          (ON_TextureMapping *this,ON_Plane *plane,ON_Interval *dx,ON_Interval *dy,ON_Interval *dz)

{
  ulong uVar1;
  bool bVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  ON_3dVector zaxis;
  ON_3dVector yaxis;
  ON_3dVector xaxis;
  ON_3dVector Z;
  ON_3dVector Y;
  ON_3dVector X;
  ON_3dVector local_120;
  ON_3dVector local_108;
  ON_3dVector local_e8;
  ON_3dVector local_c8;
  undefined1 local_a8 [16];
  double local_98;
  ON_3dVector local_88;
  ON_3dVector local_68;
  ON_3dVector local_48;
  
  operator=(this,&Unset);
  bVar2 = ON_3dPoint::IsValid(&plane->origin);
  if (bVar2) {
    bVar2 = ON_IsRightHandFrame(&plane->xaxis,&plane->yaxis,&plane->zaxis);
    if ((((bVar2) && (bVar2 = ON_Interval::IsValid(dx), bVar2)) &&
        (bVar2 = ON_Interval::IsValid(dy), bVar2)) && (bVar2 = ON_Interval::IsValid(dz), bVar2)) {
      dVar5 = ON_Interval::Mid(dx);
      dVar3 = ON_Interval::Mid(dy);
      dVar4 = ON_Interval::Mid(dz);
      ON_Plane::PointAt((ON_3dPoint *)local_a8,plane,dVar5,dVar3,dVar4);
      uVar1 = -(ulong)((double)local_a8._8_8_ != -(double)local_a8._8_8_) &
              (ulong)-(double)local_a8._8_8_;
      local_a8._8_4_ = (int)uVar1;
      local_a8._0_8_ =
           -(ulong)((double)local_a8._0_8_ != -(double)local_a8._0_8_) &
           (ulong)-(double)local_a8._0_8_;
      local_a8._12_4_ = (int)(uVar1 >> 0x20);
      local_98 = (double)(~-(ulong)(local_98 == -local_98) & (ulong)-local_98);
      local_c8.z = (plane->xaxis).z;
      local_c8.x = (plane->xaxis).x;
      local_c8.y = (plane->xaxis).y;
      local_e8.z = (plane->yaxis).z;
      local_e8.x = (plane->yaxis).x;
      local_e8.y = (plane->yaxis).y;
      local_108.z = (plane->zaxis).z;
      local_108.x = (plane->zaxis).x;
      local_108.y = (plane->zaxis).y;
      dVar5 = ON_Interval::Length(dx);
      dVar3 = (double)(~-(ulong)(dVar5 == 0.0) & (ulong)dVar5 |
                      -(ulong)(dVar5 == 0.0) & 0x4000000000000000);
      dVar5 = ON_Interval::Length(dy);
      dVar4 = (double)(~-(ulong)(dVar5 == 0.0) & (ulong)dVar5 |
                      -(ulong)(dVar5 == 0.0) & 0x4000000000000000);
      dVar5 = ON_Interval::Length(dz);
      dVar5 = (double)(~-(ulong)(dVar5 == 0.0) & (ulong)dVar5 |
                      -(ulong)(dVar5 == 0.0) & 0x4000000000000000);
      ::operator*(&local_48,2.0 / dVar3,&local_c8);
      ::operator*(&local_68,2.0 / dVar4,&local_e8);
      ::operator*(&local_88,2.0 / dVar5,&local_108);
      (this->m_Pxyz).m_xform[0][0] = local_48.x;
      (this->m_Pxyz).m_xform[0][1] = local_48.y;
      (this->m_Pxyz).m_xform[0][2] = local_48.z;
      (this->m_Pxyz).m_xform[0][3] =
           local_48.z * local_98 +
           local_48.x * (double)local_a8._0_8_ + local_48.y * (double)local_a8._8_8_;
      (this->m_Pxyz).m_xform[1][0] = local_68.x;
      (this->m_Pxyz).m_xform[1][1] = local_68.y;
      (this->m_Pxyz).m_xform[1][2] = local_68.z;
      (this->m_Pxyz).m_xform[1][3] =
           local_68.z * local_98 +
           local_68.x * (double)local_a8._0_8_ + local_68.y * (double)local_a8._8_8_;
      (this->m_Pxyz).m_xform[2][0] = local_88.x;
      (this->m_Pxyz).m_xform[2][1] = local_88.y;
      (this->m_Pxyz).m_xform[2][2] = local_88.z;
      (this->m_Pxyz).m_xform[2][3] =
           local_88.z * local_98 +
           local_88.x * (double)local_a8._0_8_ + local_88.y * (double)local_a8._8_8_;
      (this->m_Pxyz).m_xform[3][0] = 0.0;
      (this->m_Pxyz).m_xform[3][1] = 0.0;
      (this->m_Pxyz).m_xform[3][2] = 0.0;
      (this->m_Pxyz).m_xform[3][3] = 1.0;
      ::operator*(&local_120,dVar3 * 0.5,&local_c8);
      local_48.z = local_120.z;
      local_48.x = local_120.x;
      local_48.y = local_120.y;
      ::operator*(&local_120,dVar4 * 0.5,&local_e8);
      local_68.z = local_120.z;
      local_68.x = local_120.x;
      local_68.y = local_120.y;
      ::operator*(&local_120,dVar5 * 0.5,&local_108);
      local_88.z = local_120.z;
      local_88.x = local_120.x;
      local_88.y = local_120.y;
      (this->m_Nxyz).m_xform[0][0] = local_48.x;
      (this->m_Nxyz).m_xform[0][1] = local_48.y;
      (this->m_Nxyz).m_xform[0][2] = local_48.z;
      (this->m_Nxyz).m_xform[0][3] = 0.0;
      (this->m_Nxyz).m_xform[1][0] = local_68.x;
      (this->m_Nxyz).m_xform[1][1] = local_68.y;
      (this->m_Nxyz).m_xform[1][2] = local_68.z;
      (this->m_Nxyz).m_xform[1][3] = 0.0;
      (this->m_Nxyz).m_xform[2][0] = local_120.x;
      (this->m_Nxyz).m_xform[2][1] = local_120.y;
      (this->m_Nxyz).m_xform[2][2] = local_120.z;
      (this->m_Nxyz).m_xform[2][3] = 0.0;
      (this->m_Nxyz).m_xform[3][0] = 0.0;
      (this->m_Nxyz).m_xform[3][1] = 0.0;
      (this->m_Nxyz).m_xform[3][2] = 0.0;
      (this->m_Nxyz).m_xform[3][3] = 1.0;
      this->m_type = plane_mapping;
      ON_ModelComponent::SetId(&this->super_ON_ModelComponent);
      return true;
    }
  }
  return false;
}

Assistant:

bool ON_TextureMapping::SetPlaneMapping(
          const ON_Plane& plane,
          const ON_Interval& dx,
          const ON_Interval& dy,
          const ON_Interval& dz
          )
{
  *this = ON_TextureMapping::Unset;

  // Don't call plane.IsValid(), because the plane
  // equation does not matter and many developers
  // forget to set it correctly.
  if ( !plane.origin.IsValid() )
    return false;
  if ( !ON_IsRightHandFrame( plane.xaxis, plane.yaxis, plane.zaxis ) )
    return false;
  if ( !dx.IsValid() || !dy.IsValid() || !dz.IsValid() )
    return false;

  ON_3dPoint C = plane.PointAt(dx.Mid(),dy.Mid(),dz.Mid());
  C.x = (0.0 == C.x) ? 0.0 : -C.x;
  C.y = (0.0 == C.y) ? 0.0 : -C.y;
  C.z = (0.0 == C.z) ? 0.0 : -C.z;
  ON_3dVector xaxis = plane.xaxis;
  ON_3dVector yaxis = plane.yaxis;
  ON_3dVector zaxis = plane.zaxis;

  // Any "cleanup" needs to be done here
  // to xaxis, yaxis, zaxis.

  double sx,sy,sz;
  if ( 0.0 == (sx = dx.Length())) sx = 2.0;
  if ( 0.0 == (sy = dy.Length())) sy = 2.0;
  if ( 0.0 == (sz = dz.Length())) sz = 2.0;

  // The plane mapping matrix m_Pxyz transforms the
  // world coordinate rectangle to a (-1<=r<=1,
  // on plane to a
  // 1 X 1 square in the xy plane centered at the
  // origin.

  // m_Pxyz = surface point transformation
  ON_3dVector X = (2.0/sx)*xaxis;
  ON_3dVector Y = (2.0/sy)*yaxis;
  ON_3dVector Z = (2.0/sz)*zaxis;

  m_Pxyz.m_xform[0][0] = X.x;
  m_Pxyz.m_xform[0][1] = X.y;
  m_Pxyz.m_xform[0][2] = X.z;
  m_Pxyz.m_xform[0][3] = (X.x*C.x + X.y*C.y + X.z*C.z);

  m_Pxyz.m_xform[1][0] = Y.x;
  m_Pxyz.m_xform[1][1] = Y.y;
  m_Pxyz.m_xform[1][2] = Y.z;
  m_Pxyz.m_xform[1][3] = (Y.x*C.x + Y.y*C.y + Y.z*C.z);

  m_Pxyz.m_xform[2][0] = Z.x;
  m_Pxyz.m_xform[2][1] = Z.y;
  m_Pxyz.m_xform[2][2] = Z.z;
  m_Pxyz.m_xform[2][3] = (Z.x*C.x + Z.y*C.y + Z.z*C.z);

  m_Pxyz.m_xform[3][0] = 0.0;
  m_Pxyz.m_xform[3][1] = 0.0;
  m_Pxyz.m_xform[3][2] = 0.0;
  m_Pxyz.m_xform[3][3] = 1.0;

  // m_Nxyz = surface normal transformation
  //        = inverse transpose of upper 3x3 of m_Pxyz
  X = (0.5*sx)*xaxis;
  Y = (0.5*sy)*yaxis;
  Z = (0.5*sz)*zaxis;
  m_Nxyz.m_xform[0][0] = X.x;
  m_Nxyz.m_xform[0][1] = X.y;
  m_Nxyz.m_xform[0][2] = X.z;
  m_Nxyz.m_xform[0][3] = 0.0;

  m_Nxyz.m_xform[1][0] = Y.x;
  m_Nxyz.m_xform[1][1] = Y.y;
  m_Nxyz.m_xform[1][2] = Y.z;
  m_Nxyz.m_xform[1][3] = 0.0;

  m_Nxyz.m_xform[2][0] = Z.x;
  m_Nxyz.m_xform[2][1] = Z.y;
  m_Nxyz.m_xform[2][2] = Z.z;
  m_Nxyz.m_xform[2][3] = 0.0;

  m_Nxyz.m_xform[3][0] = 0.0;
  m_Nxyz.m_xform[3][1] = 0.0;
  m_Nxyz.m_xform[3][2] = 0.0;
  m_Nxyz.m_xform[3][3] = 1.0;

  m_type = ON_TextureMapping::TYPE::plane_mapping;
  SetId();

#if defined(ON_DEBUG)
  {
    ON_Plane p;
    p.xaxis = (2.0/sx)*plane.xaxis;
    p.yaxis = (2.0/sy)*plane.yaxis;
    p.zaxis = (2.0/sz)*plane.zaxis;
    p.origin.Set(-C.x,-C.y,-C.z);
    p.UpdateEquation();
    ON_Xform P_dbg, N_dbg;
    P_dbg.Rotation(p,ON_xy_plane);
    P_dbg.GetSurfaceNormalXform(N_dbg);

    for ( int i = 0; i < 4; i++ )
    {
      for ( int j = 0; j < 4; j++ )
      {
        if ( fabs(m_Pxyz[i][j] - P_dbg[i][j]) >= ON_SQRT_EPSILON*(fabs(m_Pxyz[i][j])+128.0) )
        {
          ON_ERROR("m_Pxyz is nor right\n");
          break;
        }
        if ( fabs(m_Nxyz[i][j] - N_dbg[i][j]) >= ON_SQRT_EPSILON*(fabs(m_Nxyz[i][j])+128.0) )
        {
          ON_ERROR("m_Nxyz is nor right\n");
          break;
        }
      }
    }
  }
#endif
	return true;
}